

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O2

uint16 __thiscall crnlib::rg_etc1::etc1_block::get_base5_color(etc1_block *this)

{
  uint64 uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [13];
  undefined1 auVar13 [15];
  
  uVar1 = (this->field_0).m_uint64;
  auVar13._2_2_ = 0;
  auVar13._0_2_ = (ushort)uVar1 >> 3;
  auVar13._4_2_ = (ushort)(uVar1 >> 0x20) >> 3;
  auVar13._6_2_ = (ushort)(uVar1 >> 0x33);
  auVar13._8_7_ = 0;
  auVar13 = auVar13 & DAT_0018d5b0._0_15_;
  auVar2[0xd] = 0;
  auVar2._0_13_ = auVar13._0_13_;
  auVar2[0xe] = auVar13[7];
  auVar3[0xc] = auVar13[6];
  auVar3._0_12_ = auVar13._0_12_;
  auVar3._13_2_ = auVar2._13_2_;
  auVar4[0xb] = 0;
  auVar4._0_11_ = auVar13._0_11_;
  auVar4._12_3_ = auVar3._12_3_;
  auVar5[10] = auVar13[5];
  auVar5._0_10_ = auVar13._0_10_;
  auVar5._11_4_ = auVar4._11_4_;
  auVar6[9] = 0;
  auVar6._0_9_ = auVar13._0_9_;
  auVar6._10_5_ = auVar5._10_5_;
  auVar7._1_6_ = auVar6._9_6_;
  auVar7[0] = auVar13[4];
  auVar7._7_8_ = 0;
  auVar8._8_7_ = 0;
  auVar8._0_8_ = SUB158(auVar7 << 0x40,7);
  auVar9._9_6_ = 0;
  auVar9._0_9_ = SUB159(auVar8 << 0x38,6);
  auVar10._10_5_ = 0;
  auVar10._0_10_ = SUB1510(auVar9 << 0x30,5);
  auVar11._11_4_ = 0;
  auVar11._0_11_ = SUB1511(auVar10 << 0x28,4);
  auVar12._1_12_ = SUB1512(auVar11 << 0x20,3);
  auVar12[0] = auVar13[1];
  return (ushort)auVar13[0] * 0x400 |
         auVar12._0_2_ * 0x20 | (ushort)((this->field_0).m_bytes[2] >> 3);
}

Assistant:

inline uint get_byte_bits(uint ofs, uint num) const
            {
                RG_ETC1_ASSERT((ofs + num) <= 64U);
                RG_ETC1_ASSERT(num && (num <= 8U));
                RG_ETC1_ASSERT((ofs >> 3) == ((ofs + num - 1) >> 3));
                const uint byte_ofs = 7 - (ofs >> 3);
                const uint byte_bit_ofs = ofs & 7;
                return (m_bytes[byte_ofs] >> byte_bit_ofs) & ((1 << num) - 1);
            }